

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_client_hello(ptls_t *tls,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties)

{
  code *pcVar1;
  undefined8 uVar2;
  long lVar3;
  uint16_t uVar4;
  st_ptls_client_hello_t *psVar5;
  uint uVar6;
  int iVar7;
  uint8_t *puVar8;
  size_t *psVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t auVar14 [8];
  ptls_iovec_t pVar15;
  uint8_t *end_20;
  size_t _block_size_19;
  size_t _capacity_19;
  size_t local_348;
  uint8_t *end_19;
  size_t _block_size_18;
  size_t _capacity_18;
  size_t num_binders;
  uint8_t *end_18;
  size_t _block_size_17;
  size_t _capacity_17;
  uint8_t *local_300;
  uint8_t *end_17;
  size_t _block_size_16;
  size_t _capacity_16;
  st_ptls_client_hello_psk_t psk;
  uint8_t *end_16;
  size_t _block_size_15;
  size_t _capacity_15;
  size_t num_identities;
  size_t local_290;
  uint8_t *end_15;
  size_t _block_size_14;
  size_t _capacity_14;
  size_t local_268;
  uint8_t *end_14;
  size_t _block_size_13;
  size_t _capacity_13;
  uint8_t *end_13;
  size_t _block_size_12;
  size_t _capacity_12;
  uint8_t *end_12;
  size_t _block_size_11;
  size_t _capacity_11;
  size_t local_210;
  uint16_t local_202;
  size_t sStack_200;
  uint16_t v;
  size_t i;
  size_t selected_index;
  uint8_t *end_11;
  size_t _block_size_10;
  size_t _capacity_10;
  size_t local_1d0;
  ptls_iovec_t local_1c8;
  uint16_t local_1b2;
  uint8_t *puStack_1b0;
  uint16_t id_1;
  uint8_t *end_10;
  size_t _block_size_9;
  size_t _capacity_9;
  size_t local_190;
  uint8_t *local_188;
  uint8_t *end_9;
  size_t _block_size_8;
  size_t _capacity_8;
  uint8_t *end_8;
  size_t _block_size_7;
  size_t _capacity_7;
  size_t local_150;
  ulong local_148;
  size_t len_1;
  uint8_t *end_7;
  size_t _block_size_6;
  size_t _capacity_6;
  size_t len;
  uint8_t *end_6;
  size_t _block_size_5;
  size_t _capacity_5;
  long *plStack_100;
  uint16_t csid;
  ptls_cipher_suite_t **cipher;
  size_t local_f0;
  uint8_t *local_e8;
  uint8_t *end_5;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  st_ptls_extension_bitmap_t bitmap;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  uint16_t *id;
  size_t local_88;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t local_60;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  uint local_38;
  uint16_t protver;
  int ret;
  uint16_t exttype;
  ptls_handshake_properties_t *properties_local;
  uint8_t *end_local;
  uint8_t *src_local;
  st_ptls_client_hello_t *ch_local;
  ptls_t *tls_local;
  
  protver = 0;
  _ret = properties;
  properties_local = (ptls_handshake_properties_t *)end;
  end_local = src;
  src_local = (uint8_t *)ch;
  ch_local = (st_ptls_client_hello_t *)tls;
  local_38 = ptls_decode16((uint16_t *)((long)&_capacity + 6),&end_local,end);
  puVar13 = src_local;
  if (local_38 == 0) {
    if (_capacity._6_2_ == 0x303) {
      if ((long)properties_local - (long)end_local < 0x20) {
        local_38 = 0x32;
      }
      else {
        *(uint8_t **)src_local = end_local;
        _block_size = 1;
        if (properties_local == (ptls_handshake_properties_t *)(end_local + 0x20)) {
          local_38 = 0x32;
        }
        else {
          end_1 = (uint8_t *)0x0;
          end_local = end_local + 0x20;
          do {
            puVar12 = end_local + 1;
            end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end_local);
            _block_size = _block_size - 1;
            end_local = puVar12;
          } while (_block_size != 0);
          if ((uint8_t *)((long)properties_local - (long)puVar12) < end_1) {
            local_38 = 0x32;
          }
          else {
            puVar8 = puVar12 + (long)end_1;
            if ((long)puVar8 - (long)puVar12 < 0x21) {
              pVar15 = ptls_iovec_init(puVar12,(long)puVar8 - (long)puVar12);
              puVar12 = src_local;
              _capacity_1 = (size_t)pVar15.base;
              *(size_t *)(puVar13 + 8) = _capacity_1;
              local_60 = pVar15.len;
              *(size_t *)(puVar13 + 0x10) = local_60;
              _block_size_1 = 2;
              if ((ulong)((long)properties_local - (long)puVar8) < 2) {
                local_38 = 0x32;
              }
              else {
                end_2 = (uint8_t *)0x0;
                end_local = puVar8;
                do {
                  puVar13 = end_local + 1;
                  end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end_local);
                  _block_size_1 = _block_size_1 - 1;
                  end_local = puVar13;
                } while (_block_size_1 != 0);
                if ((uint8_t *)((long)properties_local - (long)puVar13) < end_2) {
                  local_38 = 0x32;
                }
                else {
                  puVar8 = puVar13 + (long)end_2;
                  pVar15 = ptls_iovec_init(puVar13,(long)puVar8 - (long)puVar13);
                  id = (uint16_t *)pVar15.base;
                  *(uint16_t **)(puVar12 + 0x30) = id;
                  local_88 = pVar15.len;
                  *(size_t *)(puVar12 + 0x38) = local_88;
                  _capacity_2 = (size_t)(src_local + 0x200);
                  uVar6 = local_38;
                  do {
                    local_38 = uVar6;
                    local_38 = ptls_decode16((uint16_t *)_capacity_2,&end_local,puVar8);
                    if (local_38 != 0) {
                      return local_38;
                    }
                    _capacity_2 = _capacity_2 + 2;
                    *(long *)(src_local + 0x240) = *(long *)(src_local + 0x240) + 1;
                    puVar13 = puVar8;
                  } while ((_capacity_2 < src_local + 0x240) &&
                          (uVar6 = 0, puVar13 = end_local, end_local != puVar8));
                  end_local = puVar13;
                  if (end_local == puVar8) {
                    _block_size_2 = 1;
                    if (properties_local == (ptls_handshake_properties_t *)end_local) {
                      local_38 = 0x32;
                    }
                    else {
                      end_3 = (uint8_t *)0x0;
                      do {
                        auVar14 = (uint8_t  [8])((long)end_local + 1);
                        end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end_local);
                        _block_size_2 = _block_size_2 - 1;
                        end_local = (uint8_t *)auVar14;
                      } while (_block_size_2 != 0);
                      if ((uint8_t *)((long)properties_local - (long)auVar14) < end_3) {
                        local_38 = 0x32;
                      }
                      else {
                        bitmap.bits = (uint8_t  [8])((long)auVar14 + (long)end_3);
                        if (auVar14 == bitmap.bits) {
                          local_38 = 0x32;
                        }
                        else {
                          *(uint8_t (*) [8])(src_local + 0x18) = auVar14;
                          *(long *)(src_local + 0x20) = (long)bitmap.bits - (long)auVar14;
                          end_local = (uint8_t *)bitmap.bits;
                          init_extension_bitmap((st_ptls_extension_bitmap_t *)&_capacity_3,'\x01');
                          _block_size_3 = 2;
                          if ((ulong)((long)properties_local - (long)end_local) < 2) {
                            local_38 = 0x32;
                          }
                          else {
                            end_4 = (uint8_t *)0x0;
                            do {
                              puVar13 = end_local + 1;
                              end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end_local);
                              _block_size_3 = _block_size_3 - 1;
                              end_local = puVar13;
                            } while (_block_size_3 != 0);
                            if ((uint8_t *)((long)properties_local - (long)puVar13) < end_4) {
                              local_38 = 0x32;
                            }
                            else {
                              _capacity_4 = (size_t)(puVar13 + (long)end_4);
                              _block_size_3 = 0;
                              while (end_local != (uint8_t *)_capacity_4) {
                                local_38 = ptls_decode16(&protver,&end_local,(uint8_t *)_capacity_4)
                                ;
                                if (local_38 != 0) {
                                  return local_38;
                                }
                                iVar7 = extension_bitmap_is_set
                                                  ((st_ptls_extension_bitmap_t *)&_capacity_3,
                                                   protver);
                                if (iVar7 != 0) {
                                  return 0x2f;
                                }
                                extension_bitmap_set
                                          ((st_ptls_extension_bitmap_t *)&_capacity_3,protver);
                                psVar5 = ch_local;
                                uVar4 = protver;
                                _block_size_4 = 2;
                                if (_capacity_4 - (long)end_local < 2) {
                                  return 0x32;
                                }
                                end_5 = (uint8_t *)0x0;
                                do {
                                  puVar13 = end_local + 1;
                                  end_5 = (uint8_t *)((long)end_5 << 8 | (ulong)*end_local);
                                  _block_size_4 = _block_size_4 - 1;
                                  end_local = puVar13;
                                } while (_block_size_4 != 0);
                                if ((uint8_t *)(_capacity_4 - (long)puVar13) < end_5) {
                                  return 0x32;
                                }
                                local_e8 = puVar13 + (long)end_5;
                                if (*(long *)(ch_local->random_bytes + 0xb8) != 0) {
                                  pcVar1 = (code *)**(undefined8 **)(ch_local->random_bytes + 0xb8);
                                  uVar2 = *(undefined8 *)(ch_local->random_bytes + 0xb8);
                                  _cipher = ptls_iovec_init(puVar13,(long)local_e8 - (long)puVar13);
                                  iVar7 = (*pcVar1)(uVar2,psVar5,1,uVar4,cipher,local_f0);
                                  local_38 = (uint)(iVar7 != 0);
                                  if (iVar7 != 0) {
                                    return local_38;
                                  }
                                }
                                puVar13 = src_local;
                                if (protver == 0) {
                                  iVar7 = client_hello_decode_server_name
                                                    ((ptls_iovec_t *)(src_local + 0x88),&end_local,
                                                     local_e8);
                                  if (iVar7 != 0) {
                                    return iVar7;
                                  }
                                  if (end_local != local_e8) {
                                    return 0x32;
                                  }
                                  local_38 = 0;
                                }
                                else if (protver == 5) {
                                  src_local[0x4e0] = src_local[0x4e0] & 0xfe | 1;
                                }
                                else if (protver == 10) {
                                  local_1c8 = ptls_iovec_init(end_local,
                                                              (long)local_e8 - (long)end_local);
                                  *(uint8_t **)(puVar13 + 0x40) = local_1c8.base;
                                  *(size_t *)(puVar13 + 0x48) = local_1c8.len;
                                }
                                else if (protver == 0xd) {
                                  iVar7 = decode_signature_algorithms
                                                    ((st_ptls_signature_algorithms_t *)
                                                     (src_local + 0x60),&end_local,local_e8);
                                  if (iVar7 != 0) {
                                    return iVar7;
                                  }
                                  local_38 = 0;
                                }
                                else if (protver == 0x10) {
                                  _block_size_7 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_8 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_8 = (uint8_t *)((long)end_8 << 8 | (ulong)*end_local);
                                    _block_size_7 = _block_size_7 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_7 != 0);
                                  if (local_e8 + -(long)puVar13 < end_8) {
                                    return 0x32;
                                  }
                                  _capacity_8 = (size_t)(puVar13 + (long)end_8);
                                  _block_size_7 = 0;
                                  do {
                                    _block_size_8 = 1;
                                    if ((uint8_t *)_capacity_8 == end_local) {
                                      return 0x32;
                                    }
                                    end_9 = (uint8_t *)0x0;
                                    do {
                                      puVar13 = end_local + 1;
                                      end_9 = (uint8_t *)((long)end_9 << 8 | (ulong)*end_local);
                                      _block_size_8 = _block_size_8 - 1;
                                      end_local = puVar13;
                                    } while (_block_size_8 != 0);
                                    if ((uint8_t *)(_capacity_8 - (long)puVar13) < end_9) {
                                      return 0x32;
                                    }
                                    local_188 = puVar13 + (long)end_9;
                                    if (puVar13 == local_188) {
                                      return 0x32;
                                    }
                                    if (*(ulong *)(src_local + 0x1d0) < 0x10) {
                                      lVar3 = *(long *)(src_local + 0x1d0);
                                      *(long *)(src_local + 0x1d0) = lVar3 + 1;
                                      psVar9 = (size_t *)(src_local + lVar3 * 0x10 + 0xd0);
                                      __capacity_9 = ptls_iovec_init(puVar13,(long)local_188 -
                                                                             (long)puVar13);
                                      *psVar9 = _capacity_9;
                                      psVar9[1] = local_190;
                                    }
                                    end_local = local_188;
                                  } while (local_188 != (uint8_t *)_capacity_8);
                                  if (local_188 != (uint8_t *)_capacity_8) {
                                    return 0x32;
                                  }
                                  if (local_188 != local_e8) {
                                    return 0x32;
                                  }
                                }
                                else if (protver == 0x1b) {
                                  _block_size_9 = 1;
                                  if (local_e8 == end_local) {
                                    return 0x32;
                                  }
                                  end_10 = (uint8_t *)0x0;
                                  do {
                                    puStack_1b0 = end_local + 1;
                                    end_10 = (uint8_t *)((long)end_10 << 8 | (ulong)*end_local);
                                    _block_size_9 = _block_size_9 - 1;
                                    end_local = puStack_1b0;
                                  } while (_block_size_9 != 0);
                                  if (local_e8 + -(long)puStack_1b0 < end_10) {
                                    return 0x32;
                                  }
                                  puStack_1b0 = puStack_1b0 + (long)end_10;
                                  _block_size_9 = 0;
                                  do {
                                    iVar7 = ptls_decode16(&local_1b2,&end_local,puStack_1b0);
                                    if (iVar7 != 0) {
                                      return iVar7;
                                    }
                                    if (*(ulong *)(src_local + 0x1f8) < 0x10) {
                                      lVar3 = *(long *)(src_local + 0x1f8);
                                      *(long *)(src_local + 0x1f8) = lVar3 + 1;
                                      *(uint16_t *)(src_local + lVar3 * 2 + 0x1d8) = local_1b2;
                                    }
                                    local_38 = 0;
                                  } while (end_local != puStack_1b0);
                                  if (end_local != puStack_1b0) {
                                    return 0x32;
                                  }
                                  if (end_local != local_e8) {
                                    return 0x32;
                                  }
                                  local_38 = 0;
                                }
                                else if (protver == 0x29) {
                                  _capacity_15 = 0;
                                  _block_size_15 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_16 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_16 = (uint8_t *)((long)end_16 << 8 | (ulong)*end_local);
                                    _block_size_15 = _block_size_15 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_15 != 0);
                                  if (local_e8 + -(long)puVar13 < end_16) {
                                    return 0x32;
                                  }
                                  psk.binder.len = (size_t)(puVar13 + (long)end_16);
                                  do {
                                    memset(&_capacity_16,0,0x28);
                                    _block_size_16 = 2;
                                    if (psk.binder.len - (long)end_local < 2) {
                                      return 0x32;
                                    }
                                    end_17 = (uint8_t *)0x0;
                                    do {
                                      puVar13 = end_local + 1;
                                      end_17 = (uint8_t *)((long)end_17 << 8 | (ulong)*end_local);
                                      _block_size_16 = _block_size_16 - 1;
                                      end_local = puVar13;
                                    } while (_block_size_16 != 0);
                                    if ((uint8_t *)(psk.binder.len - (long)puVar13) < end_17) {
                                      return 0x32;
                                    }
                                    pVar15 = ptls_iovec_init(puVar13,(long)(puVar13 + (long)end_17)
                                                                     - (long)puVar13);
                                    _capacity_17 = (size_t)pVar15.base;
                                    _capacity_16 = _capacity_17;
                                    local_300 = (uint8_t *)pVar15.len;
                                    psk.identity.base = local_300;
                                    end_local = puVar13 + (long)end_17;
                                    local_38 = ptls_decode32((uint32_t *)&psk.identity.len,
                                                             &end_local,(uint8_t *)psk.binder.len);
                                    if (local_38 != 0) {
                                      return local_38;
                                    }
                                    if (*(ulong *)(src_local + 0x338) < 4) {
                                      lVar3 = *(long *)(src_local + 0x338);
                                      *(long *)(src_local + 0x338) = lVar3 + 1;
                                      memcpy(src_local + lVar3 * 0x28 + 0x298,&_capacity_16,0x28);
                                    }
                                    _capacity_15 = _capacity_15 + 1;
                                  } while (end_local != (uint8_t *)psk.binder.len);
                                  if (end_local != (uint8_t *)psk.binder.len) {
                                    return 0x32;
                                  }
                                  *(uint8_t **)(src_local + 0x290) = end_local;
                                  _block_size_17 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_18 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_18 = (uint8_t *)((long)end_18 << 8 | (ulong)*end_local);
                                    _block_size_17 = _block_size_17 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_17 != 0);
                                  if (local_e8 + -(long)puVar13 < end_18) {
                                    return 0x32;
                                  }
                                  puVar13 = puVar13 + (long)end_18;
                                  _capacity_18 = 0;
                                  do {
                                    puVar12 = src_local;
                                    _block_size_18 = 1;
                                    if (puVar13 == end_local) {
                                      return 0x32;
                                    }
                                    end_19 = (uint8_t *)0x0;
                                    do {
                                      puVar8 = end_local + 1;
                                      end_19 = (uint8_t *)((long)end_19 << 8 | (ulong)*end_local);
                                      _block_size_18 = _block_size_18 - 1;
                                      end_local = puVar8;
                                    } while (_block_size_18 != 0);
                                    if (puVar13 + -(long)puVar8 < end_19) {
                                      return 0x32;
                                    }
                                    puVar10 = puVar8 + (long)end_19;
                                    if (_capacity_18 < *(ulong *)(src_local + 0x338)) {
                                      pVar15 = ptls_iovec_init(puVar8,(long)puVar10 - (long)puVar8);
                                      _capacity_19 = (size_t)pVar15.base;
                                      *(size_t *)(puVar12 + _capacity_18 * 0x28 + 0x2b0) =
                                           _capacity_19;
                                      local_348 = pVar15.len;
                                      *(size_t *)(puVar12 + _capacity_18 * 0x28 + 0x2b8) = local_348
                                      ;
                                    }
                                    _capacity_18 = _capacity_18 + 1;
                                    end_local = puVar10;
                                  } while (puVar10 != puVar13);
                                  if (_capacity_15 != _capacity_18) {
                                    return 0x2f;
                                  }
                                  if (puVar10 != puVar13) {
                                    return 0x32;
                                  }
                                  if (puVar10 != local_e8) {
                                    return 0x32;
                                  }
                                }
                                else if (protver == 0x2a) {
                                  src_local[0x344] = '\x01';
                                  src_local[0x345] = '\0';
                                  src_local[0x346] = '\0';
                                  src_local[0x347] = '\0';
                                }
                                else if (protver == 0x2b) {
                                  _block_size_10 = 1;
                                  if (local_e8 == end_local) {
                                    return 0x32;
                                  }
                                  end_11 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_11 = (uint8_t *)((long)end_11 << 8 | (ulong)*end_local);
                                    _block_size_10 = _block_size_10 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_10 != 0);
                                  if (local_e8 + -(long)puVar13 < end_11) {
                                    return 0x32;
                                  }
                                  selected_index = (size_t)(puVar13 + (long)end_11);
                                  i = 4;
                                  _block_size_10 = 0;
                                  do {
                                    iVar7 = ptls_decode16(&local_202,&end_local,
                                                          (uint8_t *)selected_index);
                                    if (iVar7 != 0) {
                                      return iVar7;
                                    }
                                    for (sStack_200 = 0; sStack_200 != i;
                                        sStack_200 = sStack_200 + 1) {
                                      if (supported_versions[sStack_200] == local_202) {
                                        i = sStack_200;
                                        break;
                                      }
                                    }
                                    local_38 = 0;
                                  } while (end_local != (uint8_t *)selected_index);
                                  if (i != 4) {
                                    *(uint16_t *)(src_local + 0x28) = supported_versions[i];
                                  }
                                  if (end_local != (uint8_t *)selected_index) {
                                    return 0x32;
                                  }
                                  if (end_local != local_e8) {
                                    return 0x32;
                                  }
                                  local_38 = 0;
                                }
                                else if (protver == 0x2c) {
                                  if ((_ret == (ptls_handshake_properties_t *)0x0) ||
                                     ((_ret->field_0).server.cookie.key == (void *)0x0)) {
                                    return 0x2f;
                                  }
                                  pVar15 = ptls_iovec_init(end_local,
                                                           (long)local_e8 - (long)end_local);
                                  puVar12 = src_local;
                                  _capacity_11 = (size_t)pVar15.base;
                                  *(size_t *)(puVar13 + 0x248) = _capacity_11;
                                  local_210 = pVar15.len;
                                  *(size_t *)(puVar13 + 0x250) = local_210;
                                  _block_size_11 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_12 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_12 = (uint8_t *)((long)end_12 << 8 | (ulong)*end_local);
                                    _block_size_11 = _block_size_11 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_11 != 0);
                                  if (local_e8 + -(long)puVar13 < end_12) {
                                    return 0x32;
                                  }
                                  puVar8 = puVar13 + (long)end_12;
                                  *(uint8_t **)(src_local + 600) = puVar13;
                                  _block_size_12 = 2;
                                  if ((ulong)((long)puVar8 - (long)puVar13) < 2) {
                                    return 0x32;
                                  }
                                  end_13 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_13 = (uint8_t *)((long)end_13 << 8 | (ulong)*end_local);
                                    _block_size_12 = _block_size_12 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_12 != 0);
                                  if (puVar8 + -(long)puVar13 < end_13) {
                                    return 0x32;
                                  }
                                  puVar10 = puVar13 + (long)end_13;
                                  _block_size_13 = 1;
                                  if (puVar10 == puVar13) {
                                    return 0x32;
                                  }
                                  end_14 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_14 = (uint8_t *)((long)end_14 << 8 | (ulong)*end_local);
                                    _block_size_13 = _block_size_13 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_13 != 0);
                                  if (puVar10 + -(long)puVar13 < end_14) {
                                    return 0x32;
                                  }
                                  puVar11 = puVar13 + (long)end_14;
                                  pVar15 = ptls_iovec_init(puVar13,(long)puVar11 - (long)puVar13);
                                  puVar13 = src_local;
                                  _capacity_14 = (size_t)pVar15.base;
                                  *(size_t *)(puVar12 + 0x268) = _capacity_14;
                                  local_268 = pVar15.len;
                                  *(size_t *)(puVar12 + 0x270) = local_268;
                                  if (puVar11 == puVar10) {
                                    return 0x32;
                                  }
                                  end_local = puVar11 + 1;
                                  if (*puVar11 == '\0') {
                                    if ((src_local[0x288] & 1) != 0) {
                                      __assert_fail("!ch->cookie.sent_key_share",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                                                  ,0xcd7,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                  );
                                    }
                                  }
                                  else {
                                    if (*puVar11 != '\x01') {
                                      return 0x32;
                                    }
                                    src_local[0x288] = src_local[0x288] & 0xfe | 1;
                                  }
                                  if (end_local != puVar10) {
                                    return 0x32;
                                  }
                                  *(long *)(src_local + 0x260) =
                                       (long)end_local - *(long *)(src_local + 600);
                                  _block_size_14 = 1;
                                  if (puVar8 == end_local) {
                                    return 0x32;
                                  }
                                  end_15 = (uint8_t *)0x0;
                                  do {
                                    puVar12 = end_local + 1;
                                    end_15 = (uint8_t *)((long)end_15 << 8 | (ulong)*end_local);
                                    _block_size_14 = _block_size_14 - 1;
                                    end_local = puVar12;
                                  } while (_block_size_14 != 0);
                                  if (puVar8 + -(long)puVar12 < end_15) {
                                    return 0x32;
                                  }
                                  puVar10 = puVar12 + (long)end_15;
                                  pVar15 = ptls_iovec_init(puVar12,(long)puVar10 - (long)puVar12);
                                  num_identities = (size_t)pVar15.base;
                                  *(size_t *)(puVar13 + 0x278) = num_identities;
                                  local_290 = pVar15.len;
                                  *(size_t *)(puVar13 + 0x280) = local_290;
                                  if (puVar10 != puVar8) {
                                    return 0x32;
                                  }
                                  if (puVar10 != puVar8) {
                                    return 0x32;
                                  }
                                  if (puVar10 != local_e8) {
                                    return 0x32;
                                  }
                                }
                                else if (protver == 0x2d) {
                                  _block_size_19 = 1;
                                  if (local_e8 == end_local) {
                                    return 0x32;
                                  }
                                  end_20 = (uint8_t *)0x0;
                                  do {
                                    puVar13 = end_local + 1;
                                    end_20 = (uint8_t *)((long)end_20 << 8 | (ulong)*end_local);
                                    _block_size_19 = _block_size_19 - 1;
                                    end_local = puVar13;
                                  } while (_block_size_19 != 0);
                                  if (local_e8 + -(long)puVar13 < end_20) {
                                    return 0x32;
                                  }
                                  puVar12 = puVar13 + (long)end_20;
                                  if (puVar13 == puVar12) {
                                    return 0x32;
                                  }
                                  for (; end_local != puVar12; end_local = end_local + 1) {
                                    if (*end_local < 0x20) {
                                      *(uint *)(src_local + 0x340) =
                                           1 << (*end_local & 0x1f) | *(uint *)(src_local + 0x340);
                                    }
                                  }
                                  if (end_local != puVar12) {
                                    return 0x32;
                                  }
                                  if (end_local != local_e8) {
                                    return 0x32;
                                  }
                                }
                                else if (protver == 0x33) {
                                  __capacity_10 =
                                       ptls_iovec_init(end_local,(long)local_e8 - (long)end_local);
                                  *(size_t *)(puVar13 + 0x50) = _capacity_10;
                                  *(size_t *)(puVar13 + 0x58) = local_1d0;
                                }
                                else if (protver == 0xffce) {
                                  if (*(long *)(src_local + 0x98) != 0) {
                                    return 0x2f;
                                  }
                                  local_38 = ptls_decode16((uint16_t *)((long)&_capacity_5 + 6),
                                                           &end_local,local_e8);
                                  if (local_38 != 0) {
                                    return local_38;
                                  }
                                  for (plStack_100 = *(long **)(ch_local->random_bytes + 0x18);
                                      (*plStack_100 != 0 &&
                                      (*(short *)*plStack_100 != _capacity_5._6_2_));
                                      plStack_100 = plStack_100 + 1) {
                                  }
                                  if (*plStack_100 == 0) {
                                    return 0x2f;
                                  }
                                  local_38 = select_key_share((ptls_key_exchange_algorithm_t **)
                                                              (src_local + 0xa0),
                                                              (ptls_iovec_t *)(src_local + 0xa8),
                                                              *(ptls_key_exchange_algorithm_t ***)
                                                               (ch_local->random_bytes + 0x10),
                                                              &end_local,local_e8,1);
                                  puVar13 = src_local;
                                  if (local_38 != 0) {
                                    return local_38;
                                  }
                                  _block_size_5 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_6 = (uint8_t *)0x0;
                                  do {
                                    puVar12 = end_local + 1;
                                    end_6 = (uint8_t *)((long)end_6 << 8 | (ulong)*end_local);
                                    _block_size_5 = _block_size_5 - 1;
                                    end_local = puVar12;
                                  } while (_block_size_5 != 0);
                                  if (local_e8 + -(long)puVar12 < end_6) {
                                    return 0x32;
                                  }
                                  len = (size_t)(puVar12 + (long)end_6);
                                  _capacity_6 = len - (long)puVar12;
                                  if (_capacity_6 != *(size_t *)(*(long *)(*plStack_100 + 0x10) + 8)
                                     ) {
                                    return 0x2f;
                                  }
                                  *(uint8_t **)(src_local + 0xb8) = puVar12;
                                  end_local = puVar12 + _capacity_6;
                                  if (end_local != (uint8_t *)len) {
                                    return 0x32;
                                  }
                                  _block_size_6 = 2;
                                  if ((ulong)((long)local_e8 - (long)end_local) < 2) {
                                    return 0x32;
                                  }
                                  end_7 = (uint8_t *)0x0;
                                  do {
                                    puVar12 = end_local + 1;
                                    end_7 = (uint8_t *)((long)end_7 << 8 | (ulong)*end_local);
                                    _block_size_6 = _block_size_6 - 1;
                                    end_local = puVar12;
                                  } while (_block_size_6 != 0);
                                  if (local_e8 + -(long)puVar12 < end_7) {
                                    return 0x32;
                                  }
                                  len_1 = (size_t)(puVar12 + (long)end_7);
                                  local_148 = len_1 - (long)puVar12;
                                  if (local_148 < *(ulong *)(*(long *)(*plStack_100 + 8) + 0x28)) {
                                    return 0x2f;
                                  }
                                  __capacity_7 = ptls_iovec_init(puVar12,local_148);
                                  *(size_t *)(puVar13 + 0xc0) = _capacity_7;
                                  *(size_t *)(puVar13 + 200) = local_150;
                                  if (end_local + local_148 != (uint8_t *)len_1) {
                                    return 0x32;
                                  }
                                  if (end_local + local_148 != local_e8) {
                                    return 0x32;
                                  }
                                  *(long *)(src_local + 0x98) = *plStack_100;
                                }
                                else {
                                  handle_unknown_extension
                                            ((ptls_t *)ch_local,_ret,protver,end_local,local_e8,
                                             (ptls_raw_extension_t *)(src_local + 0x348));
                                }
                                end_local = local_e8;
                              }
                              if (end_local == (uint8_t *)_capacity_4) {
                                if ((ptls_handshake_properties_t *)end_local == properties_local) {
                                  iVar7 = is_supported_version(*(uint16_t *)(src_local + 0x28));
                                  if (iVar7 == 0) {
                                    local_38 = 0x46;
                                  }
                                  else if ((*(long *)(src_local + 0x20) == 1) &&
                                          (**(char **)(src_local + 0x18) == '\0')) {
                                    if ((*(long *)(src_local + 0x98) == 0) ||
                                       (*(long *)(src_local + 0x50) != 0)) {
                                      if (*(long *)(src_local + 0x290) == 0) {
                                        if (*(int *)(src_local + 0x344) != 0) {
                                          return 0x2f;
                                        }
                                      }
                                      else if (protver != 0x29) {
                                        return 0x2f;
                                      }
                                      local_38 = 0;
                                    }
                                    else {
                                      local_38 = 0x2f;
                                    }
                                  }
                                  else {
                                    local_38 = 0x2f;
                                  }
                                }
                                else {
                                  local_38 = 0x32;
                                }
                              }
                              else {
                                local_38 = 0x32;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    local_38 = 0x32;
                  }
                }
              }
            }
            else {
              local_38 = 0x32;
            }
          }
        }
      }
    }
    else {
      local_38 = 0x28;
    }
  }
  return local_38;
}

Assistant:

static int decode_client_hello(ptls_t *tls, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties)
{
    uint16_t exttype = 0;
    int ret;

    { /* check protocol version */
        uint16_t protver;
        if ((ret = ptls_decode16(&protver, &src, end)) != 0)
            goto Exit;
        if (protver != 0x0303) {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
            goto Exit;
        }
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        uint16_t *id = ch->client_ciphers.list;
        do {
            if ((ret = ptls_decode16(id, &src, end)) != 0)
                goto Exit;
            id++;
            ch->client_ciphers.count++;
            if (id >= ch->client_ciphers.list + MAX_CLIENT_CIPHERS) {
                src = end;
                break;
            }
        } while (src != end);
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* decode extensions */
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME: {
            ptls_cipher_suite_t **cipher;
            if (ch->esni.cipher != NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            { /* cipher-suite */
                uint16_t csid;
                if ((ret = ptls_decode16(&csid, &src, end)) != 0)
                    goto Exit;
                for (cipher = tls->ctx->cipher_suites; *cipher != NULL; ++cipher)
                    if ((*cipher)->id == csid)
                        break;
                if (*cipher == NULL) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            }
            /* key-share (including peer-key) */
            if ((ret = select_key_share(&ch->esni.key_share, &ch->esni.peer_key, tls->ctx->key_exchanges, &src, end, 1)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, {
                size_t len = end - src;
                if (len != (*cipher)->hash->digest_size) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
                ch->esni.record_digest = src;
                src += len;
            });
            ptls_decode_block(src, end, 2, {
                size_t len = end - src;
                if (len < (*cipher)->aead->tag_size) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
                ch->esni.encrypted_sni = ptls_iovec_init(src, len);
                src += len;
            });
            ch->esni.cipher = *cipher; /* set only after successful parsing */
        } break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < sizeof(ch->alpn.list) / sizeof(ch->alpn.list[0]))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count <
                        sizeof(ch->cert_compression_algos.list) / sizeof(ch->cert_compression_algos.list[0]))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = sizeof(supported_versions) / sizeof(supported_versions[0]);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != sizeof(supported_versions) / sizeof(supported_versions[0]))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    switch (*src++) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    struct st_ptls_client_hello_psk_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < sizeof(ch->psk.identities.list) / sizeof(ch->psk.identities.list[0]))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                if (src == end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                for (; src != end; ++src) {
                    if (*src < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << *src;
                }
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        default:
            handle_unknown_extension(tls, properties, exttype, src, end, ch->unknown_extensions);
            break;
        }
        src = end;
    });

    /* check if client hello make sense */
    if (is_supported_version(ch->selected_version)) {
        if (!(ch->compression_methods.count == 1 && ch->compression_methods.ids[0] == 0)) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        /* esni */
        if (ch->esni.cipher != NULL) {
            if (ch->key_shares.base == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
        /* pre-shared key */
        if (ch->psk.hash_end != NULL) {
            /* PSK must be the last extension */
            if (exttype != PTLS_EXTENSION_TYPE_PRE_SHARED_KEY) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        } else {
            if (ch->psk.early_data_indication) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        }
    } else {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}